

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfectorHelpers.hpp
# Opt level: O1

void __thiscall
Infector::AnyShared<CFooBar,IFoo,IBar>::resolve_multiple_cast<IFoo,IBar>
          (AnyShared<CFooBar,IFoo,IBar> *this,CFooBar *tp)

{
  mapped_type *ppvVar1;
  mapped_type pvVar2;
  key_type local_20;
  
  if (tp == (CFooBar *)0x0) {
    pvVar2 = (mapped_type)0x0;
  }
  else {
    pvVar2 = &tp->field_0x0 + *(long *)(*(long *)tp + -0x28);
  }
  local_20._M_target = (type_info *)&IFoo::typeinfo;
  ppvVar1 = std::__detail::
            _Map_base<std::type_index,_std::pair<const_std::type_index,_void_*>,_std::allocator<std::pair<const_std::type_index,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<std::type_index,_std::pair<const_std::type_index,_void_*>,_std::allocator<std::pair<const_std::type_index,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)(this + 0x20),&local_20);
  *ppvVar1 = pvVar2;
  if (tp == (CFooBar *)0x0) {
    pvVar2 = (mapped_type)0x0;
  }
  else {
    pvVar2 = &tp->field_0x0 + *(long *)(*(long *)tp + -0x30);
  }
  local_20._M_target = (type_info *)&IBar::typeinfo;
  ppvVar1 = std::__detail::
            _Map_base<std::type_index,_std::pair<const_std::type_index,_void_*>,_std::allocator<std::pair<const_std::type_index,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<std::type_index,_std::pair<const_std::type_index,_void_*>,_std::allocator<std::pair<const_std::type_index,_void_*>_>,_std::__detail::_Select1st,_std::equal_to<std::type_index>,_std::hash<std::type_index>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)(this + 0x20),&local_20);
  *ppvVar1 = pvVar2;
  return;
}

Assistant:

void resolve_multiple_cast(T*tp){
            Base1* base  = tp;
            multi_solver[std::type_index(typeid(Base1))]
                          = reinterpret_cast<void*>(base);
            resolve_multiple_cast<NextBase,Others...>(tp);
        }